

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeShortFunctionDefinition(ExpressionContext *ctx,SynShortFunctionDefinition *syntax)

{
  IntrusiveList<TypeHandle> arguments_00;
  int iVar1;
  SynShortFunctionArgument *pSVar2;
  undefined4 extraout_var;
  TypeFunction *argumentType;
  ExprBase *pEVar3;
  uint uVar4;
  uint i;
  uint uVar5;
  IntrusiveList<TypeHandle> arguments;
  IntrusiveList<TypeHandle> local_38;
  TypeHandle *node;
  
  local_38.head = (TypeHandle *)0x0;
  local_38.tail = (TypeHandle *)0x0;
  uVar5 = 0;
  while( true ) {
    pSVar2 = (syntax->arguments).head;
    uVar4 = 0;
    if (pSVar2 != (SynShortFunctionArgument *)0x0) {
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        pSVar2 = (SynShortFunctionArgument *)(pSVar2->super_SynBase).next;
      } while (pSVar2 != (SynShortFunctionArgument *)0x0);
    }
    if (uVar4 <= uVar5) break;
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
    node = (TypeHandle *)CONCAT44(extraout_var,iVar1);
    node->type = ctx->typeGeneric;
    node->next = (TypeHandle *)0x0;
    node->listed = false;
    IntrusiveList<TypeHandle>::push_back(&local_38,node);
    uVar5 = uVar5 + 1;
  }
  arguments_00.tail = local_38.tail;
  arguments_00.head = local_38.head;
  argumentType = ExpressionContext::GetFunctionType
                           (ctx,&syntax->super_SynBase,ctx->typeGeneric,arguments_00);
  pEVar3 = AnalyzeShortFunctionDefinition(ctx,syntax,(FunctionData *)0x0,argumentType);
  return pEVar3;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax)
{
	IntrusiveList<TypeHandle> arguments;

	for(unsigned i = 0; i < syntax->arguments.size(); i++)
		arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ctx.typeGeneric));

	TypeFunction *typeFunction = ctx.GetFunctionType(syntax, ctx.typeGeneric, arguments);

	return AnalyzeShortFunctionDefinition(ctx, syntax, NULL, typeFunction);
}